

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

Result * CoreML::Model::validateGeneric(Result *__return_storage_ptr__,Model *model)

{
  int modelVersion;
  bool bVar1;
  ostream *poVar2;
  ModelDescription *interface;
  Result *this;
  string err;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  Result r;
  
  modelVersion = model->specificationversion_;
  if (modelVersion == 0) {
    std::__cxx11::string::string
              ((string *)&r,"Model specification version field missing or corrupt.",
               (allocator *)&err);
    Result::Result(__return_storage_ptr__,INVALID_COMPATIBILITY_VERSION,(string *)&r);
    this = &r;
    goto LAB_00204eb0;
  }
  if (5 < modelVersion) {
    std::__cxx11::stringstream::stringstream((stringstream *)&r);
    poVar2 = std::operator<<((ostream *)&r.m_message._M_string_length,
                             "The .mlmodel supplied is of version ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,model->specificationversion_);
    poVar2 = std::operator<<(poVar2,
                             ", intended for a newer version of Xcode. This version of Xcode supports model version "
                            );
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,5);
    std::operator<<(poVar2," or earlier.");
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,UNSUPPORTED_COMPATIBILITY_VERSION,&err);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::stringstream::~stringstream((stringstream *)&r);
    return __return_storage_ptr__;
  }
  interface = model->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  validateModelDescription(&r,interface,modelVersion);
  bVar1 = Result::good(&r);
  if (bVar1) {
    if (model->isupdatable_ == true) {
      if (3 < model->specificationversion_) {
        validateCanModelBeUpdatable((Result *)&err,model);
        Result::operator=(&r,(Result *)&err);
        std::__cxx11::string::~string((string *)&err._M_string_length);
        goto LAB_00204e83;
      }
      std::__cxx11::to_string(&local_1e0,4);
      std::operator+(&local_1c0,"Model specification version for an updatable model must be \'",
                     &local_1e0);
      std::operator+(&err,&local_1c0,"\' or above.");
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      Result::Result(__return_storage_ptr__,INVALID_COMPATIBILITY_VERSION,&err);
      std::__cxx11::string::~string((string *)&err);
    }
    else {
LAB_00204e83:
      bVar1 = Result::good(&r);
      if (!bVar1) goto LAB_00204e9e;
      validateOptional(__return_storage_ptr__,model);
    }
  }
  else {
LAB_00204e9e:
    Result::Result(__return_storage_ptr__,&r);
  }
  this = (Result *)&r.m_message;
LAB_00204eb0:
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

Result Model::validateGeneric(const Specification::Model& model) {
        // make sure compat version fields are filled in
        if (model.specificationversion() == 0) {
            return Result(ResultType::INVALID_COMPATIBILITY_VERSION,
                          "Model specification version field missing or corrupt.");
        }

        // check public compatibility version
        // note: this one should always be backward compatible, so use > here
        if (model.specificationversion() > MLMODEL_SPECIFICATION_VERSION) {
            std::stringstream msg;
            msg << "The .mlmodel supplied is of version "
                << model.specificationversion()
                << ", intended for a newer version of Xcode. This version of Xcode supports model version "
                << MLMODEL_SPECIFICATION_VERSION
                << " or earlier.";
            return Result(ResultType::UNSUPPORTED_COMPATIBILITY_VERSION,
                          msg.str());
        }

        // validate model interface
        Result r = validateModelDescription(model.description(), model.specificationversion());
        if (!r.good()) {
            return r;
        }
        
        if (model.isupdatable()){
            if (model.specificationversion() < MLMODEL_SPECIFICATION_VERSION_IOS13) {
                std::string err = "Model specification version for an updatable model must be '" + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS13) + "' or above.";
                return Result(ResultType::INVALID_COMPATIBILITY_VERSION, err);
            }
            r = validateCanModelBeUpdatable(model);
        }
        if (!r.good()) {
            return r;
        }

        return validateOptional(model);
    }